

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O3

void * get_FMfieldAddr_by_name(FMFieldList field_list,char *fieldname,void *data)

{
  int iVar1;
  char *__s1;
  FMFieldList p_Var2;
  
  __s1 = field_list->field_name;
  if (__s1 != (char *)0x0) {
    p_Var2 = field_list + 1;
    do {
      iVar1 = strcmp(__s1,fieldname);
      if (iVar1 == 0) {
        return (void *)((long)data + (long)p_Var2[-1].field_offset);
      }
      __s1 = p_Var2->field_name;
      p_Var2 = p_Var2 + 1;
    } while (__s1 != (char *)0x0);
  }
  return (void *)0x0;
}

Assistant:

extern void *
get_FMfieldAddr_by_name(FMFieldList field_list, const char *fieldname, void *data)
{
    int index;

    for (index = 0; field_list[index].field_name != NULL; index++) {
	if (strcmp(field_list[index].field_name, fieldname) == 0) {
	    break;
	}
    }
    if (field_list[index].field_name == NULL)
	return NULL;

    return ((char*)data) + field_list[index].field_offset;
}